

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall OmegaOP::backtracking(OmegaOP *this,uint n)

{
  uint *puVar1;
  int iVar2;
  double **ppdVar3;
  iterator iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  undefined8 in_RAX;
  int *piVar9;
  double *pdVar10;
  pointer piVar11;
  pointer pdVar12;
  ulong uVar13;
  ulong uVar14;
  iterator __position;
  ulong uVar15;
  double dVar16;
  undefined8 local_38;
  
  uVar13 = (ulong)n;
  uVar15 = 0;
  ppdVar3 = this->Q;
  dVar16 = (*ppdVar3)[uVar13];
  if (1 < (ulong)this->nbStates) {
    uVar15 = 0;
    uVar14 = 1;
    do {
      if (ppdVar3[uVar14][uVar13] < dVar16) {
        uVar15 = uVar14 & 0xffffffff;
        dVar16 = ppdVar3[uVar14][uVar13];
      }
      uVar14 = uVar14 + 1;
    } while (this->nbStates != uVar14);
    dVar16 = ppdVar3[uVar15][uVar13];
  }
  this->globalCost = dVar16;
  if (n < 2) {
    __position._M_current =
         (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_38 = in_RAX;
  }
  else {
    __position._M_current =
         (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_38 = in_RAX;
    do {
      local_38 = CONCAT44((int)uVar13,(int)local_38);
      if (__position._M_current ==
          (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->changepoints,__position,(int *)((long)&local_38 + 4));
      }
      else {
        *__position._M_current = (int)uVar13;
        (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar4._M_current =
           (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->parameters,iVar4,
                   this->states + uVar15);
      }
      else {
        *iVar4._M_current = this->states[uVar15];
        (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      puVar1 = this->lastChpt[uVar15] + uVar13;
      uVar13 = (ulong)*puVar1;
      __position._M_current =
           (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar15 = (ulong)this->lastIndState[uVar15][__position._M_current[-1]];
    } while (1 < *puVar1);
  }
  local_38 = CONCAT44(local_38._4_4_,1);
  if (__position._M_current ==
      (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->changepoints,__position,(int *)&local_38);
  }
  else {
    *__position._M_current = 1;
    (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar4._M_current =
       (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->parameters,iVar4,
               this->states + uVar15);
  }
  else {
    *iVar4._M_current = this->states[uVar15];
    (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  piVar5 = (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar11 = piVar6 + -1;
  if (piVar5 < piVar11 && piVar5 != piVar6) {
    do {
      piVar9 = piVar5 + 1;
      iVar2 = *piVar5;
      *piVar5 = *piVar11;
      *piVar11 = iVar2;
      piVar11 = piVar11 + -1;
      piVar5 = piVar9;
    } while (piVar9 < piVar11);
  }
  pdVar7 = (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar12 = pdVar8 + -1;
  if (pdVar7 < pdVar12 && pdVar7 != pdVar8) {
    do {
      pdVar10 = pdVar7 + 1;
      dVar16 = *pdVar7;
      *pdVar7 = *pdVar12;
      *pdVar12 = dVar16;
      pdVar12 = pdVar12 + -1;
      pdVar7 = pdVar10;
    } while (pdVar10 < pdVar12);
  }
  return;
}

Assistant:

void OmegaOP::backtracking(unsigned int n)
{
  unsigned int p = nbStates;
  double temp_Q = Q[0][n];
  unsigned int temp_indState = 0;

  for(unsigned int v = 1; v < p; v++)
  {
    if(Q[v][n] < temp_Q)
    {
      temp_Q = Q[v][n];
      temp_indState = v;
    }
  }

  globalCost = Q[temp_indState][n]; ///fill the globalCost OmegaOP variable
  unsigned int temp_chpt = n;

  while(temp_chpt > 1)
  {
    changepoints.push_back(temp_chpt);
    parameters.push_back(states[temp_indState]);

    temp_chpt = lastChpt[temp_indState][temp_chpt];
    temp_indState = lastIndState[temp_indState][changepoints[changepoints.size()-1]];
  }

  changepoints.push_back(1);
  parameters.push_back(states[temp_indState]);

  ///reverse the vector
  std::reverse(changepoints.begin(), changepoints.end());
  std::reverse(parameters.begin(), parameters.end());
}